

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeAddExceptions(Unicode61Tokenizer *p,char *z,int bTokenChars)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  byte *pbVar4;
  uint in_EDX;
  byte *in_RSI;
  long in_RDI;
  bool bVar5;
  int i;
  int bToken;
  u32 iCode;
  uchar *zTerm;
  uchar *zCsr;
  int nNew;
  int *aNew;
  int n;
  int rc;
  void *in_stack_ffffffffffffffa8;
  long lVar6;
  int local_4c;
  uint local_44;
  byte *local_38;
  int local_2c;
  int local_18;
  
  local_18 = 0;
  sVar2 = strlen((char *)in_RSI);
  if (0 < (int)sVar2) {
    pvVar3 = sqlite3_realloc64(in_stack_ffffffffffffffa8,0x290e49);
    if (pvVar3 == (void *)0x0) {
      local_18 = 7;
    }
    else {
      local_2c = *(int *)(in_RDI + 0x90);
      local_38 = in_RSI;
      while (local_38 < in_RSI + (int)sVar2) {
        pbVar4 = local_38 + 1;
        local_44 = (uint)*local_38;
        local_38 = pbVar4;
        if (0xbf < local_44) {
          local_44 = (uint)""[local_44 - 0xc0];
          while( true ) {
            bVar5 = false;
            if (local_38 < in_RSI + (int)sVar2) {
              bVar5 = (*local_38 & 0xc0) == 0x80;
            }
            if (!bVar5) break;
            local_44 = local_44 * 0x40 + (*local_38 & 0x3f);
            local_38 = local_38 + 1;
          }
          if (((local_44 < 0x80) || ((local_44 & 0xfffff800) == 0xd800)) ||
             ((local_44 & 0xfffffffe) == 0xfffe)) {
            local_44 = 0xfffd;
          }
        }
        if (local_44 < 0x80) {
          *(char *)(in_RDI + (ulong)local_44) = (char)in_EDX;
        }
        else {
          lVar6 = in_RDI;
          iVar1 = sqlite3Fts5UnicodeCategory(local_44);
          if ((*(byte *)(lVar6 + 0xa0 + (long)iVar1) != in_EDX) &&
             (iVar1 = sqlite3Fts5UnicodeIsdiacritic(local_44), iVar1 == 0)) {
            local_4c = 0;
            while ((local_4c < local_2c &&
                   (*(uint *)((long)pvVar3 + (long)local_4c * 4) <= local_44))) {
              local_4c = local_4c + 1;
            }
            memmove((void *)((long)pvVar3 + (long)(local_4c + 1) * 4),
                    (void *)((long)pvVar3 + (long)local_4c * 4),(long)(local_2c - local_4c) << 2);
            *(uint *)((long)pvVar3 + (long)local_4c * 4) = local_44;
            local_2c = local_2c + 1;
          }
        }
      }
      *(void **)(in_RDI + 0x98) = pvVar3;
      *(int *)(in_RDI + 0x90) = local_2c;
    }
  }
  return local_18;
}

Assistant:

static int fts5UnicodeAddExceptions(
  Unicode61Tokenizer *p,          /* Tokenizer object */
  const char *z,                  /* Characters to treat as exceptions */
  int bTokenChars                 /* 1 for 'tokenchars', 0 for 'separators' */
){
  int rc = SQLITE_OK;
  int n = (int)strlen(z);
  int *aNew;

  if( n>0 ){
    aNew = (int*)sqlite3_realloc64(p->aiException,
                                   (n+p->nException)*sizeof(int));
    if( aNew ){
      int nNew = p->nException;
      const unsigned char *zCsr = (const unsigned char*)z;
      const unsigned char *zTerm = (const unsigned char*)&z[n];
      while( zCsr<zTerm ){
        u32 iCode;
        int bToken;
        READ_UTF8(zCsr, zTerm, iCode);
        if( iCode<128 ){
          p->aTokenChar[iCode] = (unsigned char)bTokenChars;
        }else{
          bToken = p->aCategory[sqlite3Fts5UnicodeCategory(iCode)];
          assert( (bToken==0 || bToken==1) );
          assert( (bTokenChars==0 || bTokenChars==1) );
          if( bToken!=bTokenChars && sqlite3Fts5UnicodeIsdiacritic(iCode)==0 ){
            int i;
            for(i=0; i<nNew; i++){
              if( (u32)aNew[i]>iCode ) break;
            }
            memmove(&aNew[i+1], &aNew[i], (nNew-i)*sizeof(int));
            aNew[i] = iCode;
            nNew++;
          }
        }
      }
      p->aiException = aNew;
      p->nException = nNew;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}